

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

CommandLineFlag * __thiscall
google::anon_unknown_1::FlagRegistry::FindFlagLocked(FlagRegistry *this,char *name)

{
  uint uVar1;
  int iVar2;
  _Base_ptr p_Var3;
  CommandLineFlag *pCVar4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  
  p_Var5 = &(this->flags_)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var5->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[uVar1 >> 0x1f]) {
    uVar1 = strcmp(*(char **)(p_Var3 + 1),name);
    if (-1 < (int)uVar1) {
      p_Var6 = p_Var3;
    }
  }
  p_Var3 = &p_Var5->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var5) &&
     (iVar2 = strcmp(name,*(char **)(p_Var6 + 1)), p_Var3 = p_Var6, iVar2 < 0)) {
    p_Var3 = &p_Var5->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var5) {
    pCVar4 = (CommandLineFlag *)0x0;
  }
  else {
    pCVar4 = (CommandLineFlag *)p_Var3[1]._M_parent;
  }
  return pCVar4;
}

Assistant:

CommandLineFlag* FlagRegistry::FindFlagLocked(const char* name) {
  FlagConstIterator i = flags_.find(name);
  if (i == flags_.end()) {
    return NULL;
  } else {
    return i->second;
  }
}